

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O1

errr parse_file(parser *p,char *filename)

{
  char *pcVar1;
  _Bool _Var2;
  parser_error pVar3;
  char *pcVar4;
  ang_file *f;
  char path [1024];
  char buf [1024];
  char acStack_828 [1024];
  char local_428 [1024];
  
  pcVar1 = ANGBAND_DIR_USER;
  pcVar4 = format("%s.txt");
  path_build(acStack_828,0x400,pcVar1,pcVar4);
  f = file_open(acStack_828,MODE_READ,FTYPE_TEXT);
  pcVar1 = ANGBAND_DIR_GAMEDATA;
  if (f == (ang_file *)0x0) {
    pcVar4 = format("%s.txt",filename);
    path_build(acStack_828,0x400,pcVar1,pcVar4);
    f = file_open(acStack_828,MODE_READ,FTYPE_TEXT);
  }
  if (f == (ang_file *)0x0) {
    pVar3 = PARSE_ERROR_NO_FILE_FOUND;
  }
  else {
    do {
      _Var2 = file_getl(f,local_428,0x400);
      if (!_Var2) {
        pVar3 = PARSE_ERROR_NONE;
        break;
      }
      pVar3 = parser_parse(p,local_428);
    } while (pVar3 == PARSE_ERROR_NONE);
    file_close(f);
  }
  return pVar3;
}

Assistant:

errr parse_file(struct parser *p, const char *filename) {
	char path[1024];
	char buf[1024];
	ang_file *fh;
	errr r = 0;

	/* The player can put a customised file in the user directory */
	path_build(path, sizeof(path), ANGBAND_DIR_USER, format("%s.txt",
															filename));
	fh = file_open(path, MODE_READ, FTYPE_TEXT);

	/* If no custom file, just load the standard one */
	if (!fh) {
		path_build(path, sizeof(path), ANGBAND_DIR_GAMEDATA,
				   format("%s.txt", filename));
		fh = file_open(path, MODE_READ, FTYPE_TEXT);
	}

	/* File wasn't found, return the error */
	if (!fh)
		return PARSE_ERROR_NO_FILE_FOUND;

	/* Parse it */
	while (file_getl(fh, buf, sizeof(buf))) {
		r = parser_parse(p, buf);
		if (r)
			break;
	}
	file_close(fh);
	return r;
}